

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

uchar lha_calcsum(uchar sum,void *pp,wchar_t offset,size_t size)

{
  uchar *p;
  size_t size_local;
  wchar_t offset_local;
  void *pp_local;
  uchar sum_local;
  
  p = (uchar *)((long)pp + (long)offset);
  sum_local = sum;
  for (size_local = size; size_local != 0; size_local = size_local - 1) {
    sum_local = sum_local + *p;
    p = p + 1;
  }
  return sum_local;
}

Assistant:

static unsigned char
lha_calcsum(unsigned char sum, const void *pp, int offset, size_t size)
{
	unsigned char const *p = (unsigned char const *)pp;

	p += offset;
	for (;size > 0; --size)
		sum += *p++;
	return (sum);
}